

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O2

size_t mserialize::
       StructSerializer<binlog::EventSource,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::id>,_std::integral_constant<binlog::Severity_binlog::EventSource::*,_&binlog::EventSource::severity>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::category>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::function>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::file>,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::line>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::formatString>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::argumentTags>_>
       ::serialized_size(EventSource *t)

{
  size_t sVar1;
  long lVar2;
  size_t field_sizes [9];
  
  field_sizes[0] = 0;
  field_sizes[1] = 8;
  field_sizes[2] = 2;
  field_sizes[3] = (t->category)._M_string_length + 4;
  field_sizes[4] = (t->function)._M_string_length + 4;
  field_sizes[5] = (t->file)._M_string_length + 4;
  field_sizes[6] = 8;
  field_sizes[7] = (t->formatString)._M_string_length + 4;
  field_sizes[8] = (t->argumentTags)._M_string_length + 4;
  sVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x48; lVar2 = lVar2 + 8) {
    sVar1 = sVar1 + *(long *)((long)field_sizes + lVar2);
  }
  return sVar1;
}

Assistant:

static std::size_t serialized_size(const T& t)
  {
    const std::size_t field_sizes[] = {0, serialized_size_member(t, Members::value)...};

    std::size_t result = 0;
    for (auto s : field_sizes) { result += s; }
    return result;
  }